

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3.pb.cc
# Opt level: O0

void __thiscall proto3_unittest::TestHasbits::Clear(TestHasbits *this)

{
  uint32_t *puVar1;
  LogMessage *pLVar2;
  LogMessage local_30;
  Voidify local_1d;
  uint local_1c;
  TestHasbits *pTStack_18;
  uint32_t cached_has_bits;
  TestHasbits *this_local;
  
  this_local = (TestHasbits *)&this->field_0;
  local_1c = 0;
  pTStack_18 = this;
  puVar1 = google::protobuf::internal::HasBits<3>::operator[](&(this->field_0)._impl_._has_bits_,0);
  local_1c = *puVar1;
  if ((local_1c & 0xff) != 0) {
    memset((void *)((long)&this->field_0 + 0x10),0,8);
  }
  if ((local_1c & 0xff00) != 0) {
    memset((void *)((long)&this->field_0 + 0x18),0,8);
  }
  if ((local_1c & 0xff0000) != 0) {
    memset((void *)((long)&this->field_0 + 0x20),0,8);
  }
  if (((local_1c & 0xff000000) != 0) &&
     (memset((void *)((long)&this->field_0 + 0x28),0,7), (local_1c & 0x80000000) != 0)) {
    if ((this->field_0)._impl_.child_ == (TestAllTypes *)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_30,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_proto3.pb.cc"
                 ,0x17dd,"_impl_.child_ != nullptr");
      pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_1d,pLVar2);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_30);
    }
    proto3_unittest::TestAllTypes::Clear((this->field_0)._impl_.child_);
  }
  puVar1 = google::protobuf::internal::HasBits<3>::operator[](&(this->field_0)._impl_._has_bits_,1);
  local_1c = *puVar1;
  if ((local_1c & 0xff) != 0) {
    memset((void *)((long)&this->field_0 + 0x38),0,8);
  }
  if ((local_1c & 0xff00) != 0) {
    memset((void *)((long)&this->field_0 + 0x40),0,8);
  }
  if ((local_1c & 0xff0000) != 0) {
    memset((void *)((long)&this->field_0 + 0x48),0,8);
  }
  if ((local_1c & 0xff000000) != 0) {
    memset((void *)((long)&this->field_0 + 0x50),0,8);
  }
  puVar1 = google::protobuf::internal::HasBits<3>::operator[](&(this->field_0)._impl_._has_bits_,2);
  local_1c = *puVar1;
  if ((local_1c & 0x3f) != 0) {
    memset((void *)((long)&this->field_0 + 0x58),0,6);
  }
  google::protobuf::internal::HasBits<3>::Clear(&(this->field_0)._impl_._has_bits_);
  google::protobuf::internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestHasbits::Clear() {
// @@protoc_insertion_point(message_clear_start:proto3_unittest.TestHasbits)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    ::memset(&_impl_.b1_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.b8_) -
        reinterpret_cast<char*>(&_impl_.b1_)) + sizeof(_impl_.b8_));
  }
  if ((cached_has_bits & 0x0000ff00u) != 0) {
    ::memset(&_impl_.b9_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.b16_) -
        reinterpret_cast<char*>(&_impl_.b9_)) + sizeof(_impl_.b16_));
  }
  if ((cached_has_bits & 0x00ff0000u) != 0) {
    ::memset(&_impl_.b17_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.b24_) -
        reinterpret_cast<char*>(&_impl_.b17_)) + sizeof(_impl_.b24_));
  }
  if ((cached_has_bits & 0xff000000u) != 0) {
    ::memset(&_impl_.b25_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.b31_) -
        reinterpret_cast<char*>(&_impl_.b25_)) + sizeof(_impl_.b31_));
    if ((cached_has_bits & 0x80000000u) != 0) {
      ABSL_DCHECK(_impl_.child_ != nullptr);
      _impl_.child_->Clear();
    }
  }
  cached_has_bits = _impl_._has_bits_[1];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    ::memset(&_impl_.b32_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.b39_) -
        reinterpret_cast<char*>(&_impl_.b32_)) + sizeof(_impl_.b39_));
  }
  if ((cached_has_bits & 0x0000ff00u) != 0) {
    ::memset(&_impl_.b40_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.b47_) -
        reinterpret_cast<char*>(&_impl_.b40_)) + sizeof(_impl_.b47_));
  }
  if ((cached_has_bits & 0x00ff0000u) != 0) {
    ::memset(&_impl_.b48_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.b55_) -
        reinterpret_cast<char*>(&_impl_.b48_)) + sizeof(_impl_.b55_));
  }
  if ((cached_has_bits & 0xff000000u) != 0) {
    ::memset(&_impl_.b56_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.b63_) -
        reinterpret_cast<char*>(&_impl_.b56_)) + sizeof(_impl_.b63_));
  }
  cached_has_bits = _impl_._has_bits_[2];
  if ((cached_has_bits & 0x0000003fu) != 0) {
    ::memset(&_impl_.b64_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.b69_) -
        reinterpret_cast<char*>(&_impl_.b64_)) + sizeof(_impl_.b69_));
  }
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}